

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcNtbdd.c
# Opt level: O0

int Abc_NtkSizeOfGlobalBdds(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  void *Entry;
  DdNode **nodeArray;
  undefined4 local_28;
  int i;
  int RetValue;
  Abc_Obj_t *pObj;
  Vec_Ptr_t *vFuncsGlob;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkCoNum(pNtk);
  p = Vec_PtrAlloc(iVar1);
  for (local_28 = 0; iVar1 = Abc_NtkCoNum(pNtk), local_28 < iVar1; local_28 = local_28 + 1) {
    pObj_00 = Abc_NtkCo(pNtk,local_28);
    Entry = Abc_ObjGlobalBdd(pObj_00);
    Vec_PtrPush(p,Entry);
  }
  nodeArray = (DdNode **)Vec_PtrArray(p);
  iVar1 = Vec_PtrSize(p);
  iVar1 = Cudd_SharingSize(nodeArray,iVar1);
  Vec_PtrFree(p);
  return iVar1;
}

Assistant:

int Abc_NtkSizeOfGlobalBdds( Abc_Ntk_t * pNtk ) 
{
    Vec_Ptr_t * vFuncsGlob;
    Abc_Obj_t * pObj;
    int RetValue, i;
    // complement the global functions
    vFuncsGlob = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
        Vec_PtrPush( vFuncsGlob, Abc_ObjGlobalBdd(pObj) );
    RetValue = Cudd_SharingSize( (DdNode **)Vec_PtrArray(vFuncsGlob), Vec_PtrSize(vFuncsGlob) );
    Vec_PtrFree( vFuncsGlob );
    return RetValue;
}